

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

ostream * operator<<(ostream *os,Context *context)

{
  Context *pCVar1;
  bool bVar2;
  _Setw _Var3;
  ostream *poVar4;
  size_type sVar5;
  reference psVar6;
  element_type *this;
  string *psVar7;
  reference __x;
  reference pvVar8;
  vector<std::shared_ptr<ContextOperation>,_std::allocator<std::shared_ptr<ContextOperation>_>_>
  *this_00;
  undefined1 local_f0 [8];
  vector<double,_std::allocator<double>_> point;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *__range1_1;
  int local_8c;
  undefined1 local_88 [8];
  shared_ptr<Image> image;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<Image>,_std::allocator<std::shared_ptr<Image>_>_> *__range1;
  vector<std::shared_ptr<Image>,_std::allocator<std::shared_ptr<Image>_>_> local_38;
  int local_1c;
  Context *local_18;
  Context *context_local;
  ostream *os_local;
  
  local_18 = context;
  context_local = (Context *)os;
  std::operator<<(os,"Back projection Context Object\n");
  pCVar1 = context_local;
  local_1c = (int)std::setw(4);
  poVar4 = std::operator<<((ostream *)pCVar1,(_Setw)local_1c);
  Context::listImages(&local_38,local_18);
  sVar5 = std::vector<std::shared_ptr<Image>,_std::allocator<std::shared_ptr<Image>_>_>::size
                    (&local_38);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar5);
  std::operator<<(poVar4,"    images { ");
  std::vector<std::shared_ptr<Image>,_std::allocator<std::shared_ptr<Image>_>_>::~vector(&local_38);
  Context::listImages((vector<std::shared_ptr<Image>,_std::allocator<std::shared_ptr<Image>_>_> *)
                      &__begin1,local_18);
  __end1 = std::vector<std::shared_ptr<Image>,_std::allocator<std::shared_ptr<Image>_>_>::begin
                     ((vector<std::shared_ptr<Image>,_std::allocator<std::shared_ptr<Image>_>_> *)
                      &__begin1);
  image.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::vector<std::shared_ptr<Image>,_std::allocator<std::shared_ptr<Image>_>_>::end
                 ((vector<std::shared_ptr<Image>,_std::allocator<std::shared_ptr<Image>_>_> *)
                  &__begin1);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::shared_ptr<Image>_*,_std::vector<std::shared_ptr<Image>,_std::allocator<std::shared_ptr<Image>_>_>_>
                                *)&image.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount);
    if (!bVar2) break;
    psVar6 = __gnu_cxx::
             __normal_iterator<const_std::shared_ptr<Image>_*,_std::vector<std::shared_ptr<Image>,_std::allocator<std::shared_ptr<Image>_>_>_>
             ::operator*(&__end1);
    std::shared_ptr<Image>::shared_ptr((shared_ptr<Image> *)local_88,psVar6);
    pCVar1 = context_local;
    this = std::__shared_ptr_access<Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_88);
    psVar7 = Image::get_fileName_abi_cxx11_(this);
    poVar4 = std::operator<<((ostream *)pCVar1,(string *)psVar7);
    std::operator<<(poVar4," ");
    std::shared_ptr<Image>::~shared_ptr((shared_ptr<Image> *)local_88);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<Image>_*,_std::vector<std::shared_ptr<Image>,_std::allocator<std::shared_ptr<Image>_>_>_>
    ::operator++(&__end1);
  }
  std::vector<std::shared_ptr<Image>,_std::allocator<std::shared_ptr<Image>_>_>::~vector
            ((vector<std::shared_ptr<Image>,_std::allocator<std::shared_ptr<Image>_>_> *)&__begin1);
  std::operator<<((ostream *)context_local,"}\n");
  pCVar1 = context_local;
  local_8c = (int)std::setw(4);
  poVar4 = std::operator<<((ostream *)pCVar1,(_Setw)local_8c);
  Context::listPoints((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       *)&__range1_1,local_18);
  sVar5 = std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)&__range1_1);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar5);
  std::operator<<(poVar4,"    points { ");
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&__range1_1);
  Context::listPoints((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       *)&__begin1_1,local_18);
  __end1_1 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::begin((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)&__begin1_1);
  point.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::end((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       *)&__begin1_1);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                        *)&point.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
    if (!bVar2) break;
    __x = __gnu_cxx::
          __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
          ::operator*(&__end1_1);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_f0,__x);
    poVar4 = std::operator<<((ostream *)context_local,"{");
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_f0,0);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar8);
    poVar4 = std::operator<<(poVar4,",");
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_f0,1);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar8);
    poVar4 = std::operator<<(poVar4,",");
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_f0,2);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar8);
    std::operator<<(poVar4,"} ");
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_f0);
    __gnu_cxx::
    __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
    ::operator++(&__end1_1);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&__begin1_1);
  std::operator<<((ostream *)context_local,"}\n");
  pCVar1 = context_local;
  _Var3 = std::setw(4);
  poVar4 = std::operator<<((ostream *)pCVar1,_Var3);
  this_00 = Context::listOperations(local_18);
  sVar5 = std::
          vector<std::shared_ptr<ContextOperation>,_std::allocator<std::shared_ptr<ContextOperation>_>_>
          ::size(this_00);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar5);
  std::operator<<(poVar4,"    operations available.");
  return (ostream *)context_local;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const Context &context)
{
    //Output the pertinent information of the context to the stream.
    os << "Back projection Context Object\n";

    os << std::setw(4) << context.listImages().size() << "    images { ";
    for (auto image : context.listImages())
    {
        os << image->get_fileName() << " ";
    }
    os << "}\n";

    os << std::setw(4) << context.listPoints().size() << "    points { ";
    for (auto point : context.listPoints())
    {
        os << "{" << point[0] << "," << point[1] << "," << point[2] << "} ";
    }
    os << "}\n";

    os << std::setw(4) << context.listOperations().size() << "    operations available.";

    return os;
}